

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O2

int xmlTextWriterEndComment(xmlTextWriterPtr writer)

{
  int iVar1;
  int iVar2;
  xmlLinkPtr lk;
  void *pvVar3;
  char *msg;
  
  if (writer == (xmlTextWriterPtr)0x0) {
    msg = "xmlTextWriterEndComment : invalid writer!\n";
    writer = (xmlTextWriterPtr)0x0;
  }
  else {
    lk = xmlListFront(writer->nodes);
    if (lk != (xmlLinkPtr)0x0) {
      pvVar3 = xmlLinkGetData(lk);
      if (pvVar3 == (void *)0x0) {
        return -1;
      }
      if (*(int *)((long)pvVar3 + 8) != 0x10) {
        return -1;
      }
      iVar1 = xmlOutputBufferWriteString(writer->out,"-->");
      if (iVar1 < 0) {
        return -1;
      }
      if (writer->indent != 0) {
        iVar2 = xmlOutputBufferWriteString(writer->out,"\n");
        if (iVar2 < 0) {
          return -1;
        }
        iVar1 = iVar2 + iVar1;
      }
      xmlListPopFront(writer->nodes);
      return iVar1;
    }
    msg = "xmlTextWriterEndComment : not allowed in this context!\n";
  }
  xmlWriterErrMsg(writer,XML_ERR_INTERNAL_ERROR,msg);
  return -1;
}

Assistant:

int
xmlTextWriterEndComment(xmlTextWriterPtr writer)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if (writer == NULL) {
        xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterEndComment : invalid writer!\n");
        return -1;
    }

    lk = xmlListFront(writer->nodes);
    if (lk == 0) {
        xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterEndComment : not allowed in this context!\n");
        return -1;
    }

    p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
    if (p == 0)
        return -1;

    sum = 0;
    switch (p->state) {
        case XML_TEXTWRITER_COMMENT:
            count = xmlOutputBufferWriteString(writer->out, "-->");
            if (count < 0)
                return -1;
            sum += count;
            break;
        default:
            return -1;
    }

    if (writer->indent) {
        count = xmlOutputBufferWriteString(writer->out, "\n");
        if (count < 0)
            return -1;
        sum += count;
    }

    xmlListPopFront(writer->nodes);
    return sum;
}